

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_schnorrsig_sha256_tagged(void)

{
  secp256k1_sha256 sha_optimized;
  secp256k1_sha256 sha;
  uchar tag [17];
  secp256k1_sha256 *in_stack_ffffffffffffff18;
  secp256k1_sha256 *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff30;
  uchar *in_stack_ffffffffffffff38;
  secp256k1_sha256 *in_stack_ffffffffffffff40;
  
  secp256k1_sha256_initialize_tagged
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  secp256k1_schnorrsig_sha256_tagged((secp256k1_sha256 *)0x161f21);
  test_sha256_eq(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  return;
}

Assistant:

static void test_schnorrsig_sha256_tagged(void) {
    unsigned char tag[] = {'B', 'I', 'P', '0', '3', '4', '0', '/', 'c', 'h', 'a', 'l', 'l', 'e', 'n', 'g', 'e'};
    secp256k1_sha256 sha;
    secp256k1_sha256 sha_optimized;

    secp256k1_sha256_initialize_tagged(&sha, (unsigned char *) tag, sizeof(tag));
    secp256k1_schnorrsig_sha256_tagged(&sha_optimized);
    test_sha256_eq(&sha, &sha_optimized);
}